

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

int __thiscall
CRegexParser::compile_char_class_expr
          (CRegexParser *this,utf8_ptr *expr,size_t *exprchars,re_machine *result_machine)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t ch2;
  wchar_t wVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  byte *p;
  ulong uVar10;
  long lVar11;
  byte *local_68;
  int local_50;
  size_t *local_48;
  
  sVar2 = *exprchars;
  bVar1 = *expr->p_;
  uVar10 = sVar2 - 1;
  if (uVar10 == 0) {
    this->range_buf_cnt_ = 0;
  }
  else {
    bVar3 = bVar1 >> 7;
    local_68 = (byte *)(expr->p_ +
                       (ulong)((uint)bVar3 + (uint)bVar3 * 2 & ((bVar1 >> 5 & 1) != 0) + 1) + 1);
    wVar4 = utf8_ptr::s_getch((char *)local_68);
    if (wVar4 == L'^') {
      bVar1 = *local_68;
      this->range_buf_cnt_ = 0;
      uVar10 = sVar2 - 2;
      if (uVar10 == 0) {
        return 0;
      }
      bVar3 = bVar1 >> 7;
      local_68 = local_68 + (ulong)((uint)bVar3 + (uint)bVar3 * 2 & ((bVar1 >> 5 & 1) != 0) + 1) + 1
      ;
      local_50 = 1;
    }
    else {
      this->range_buf_cnt_ = 0;
      local_50 = 0;
    }
    do {
      local_48 = &this->range_buf_cnt_;
      uVar9 = 0;
      p = local_68;
      while ((wVar5 = utf8_ptr::s_getch((char *)p), wVar5 != L'>' && (wVar5 != L'|'))) {
        p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
        uVar9 = uVar9 + 1;
        if (uVar10 == uVar9) {
          return 0;
        }
      }
      if (uVar9 == 3) {
        wVar6 = utf8_ptr::s_getch_at((char *)local_68,1);
        if (wVar6 != L'-') goto LAB_002aeb11;
        wVar6 = utf8_ptr::s_getch((char *)local_68);
        ch2 = utf8_ptr::s_getch_at((char *)local_68,2);
LAB_002aeb05:
        add_range_char(this,wVar6,ch2);
      }
      else {
        if (uVar9 == 1) {
          ch2 = utf8_ptr::s_getch((char *)local_68);
          wVar6 = ch2;
          goto LAB_002aeb05;
        }
LAB_002aeb11:
        lVar11 = 0x14;
        while (((long)p - (long)local_68 != *(size_t *)((long)&PTR_typeinfo_00368620 + lVar11 + 4)
               || (iVar7 = memicmp(local_68,*(void **)((long)&PTR_typeinfo_name_00368618 +
                                                      lVar11 + 4),(long)p - (long)local_68),
                  iVar7 != 0))) {
          lVar11 = lVar11 + 0x18;
          if (lVar11 == 0x344) {
            return 0;
          }
        }
        wVar6 = *(wchar_t *)((long)&compile_char_class_expr::classes[0].name + lVar11);
        if (wVar6 == L'\x01') {
          add_range_char(this,*(wchar_t *)(&UNK_0036862c + lVar11),
                         *(wchar_t *)(&UNK_0036862c + lVar11));
        }
        else {
          if (((wVar4 != L'^') && (wVar5 == L'>')) && (*local_48 == 0)) {
            build_special(this,result_machine,wVar6,L'\0');
            expr->p_ = (char *)p;
            *exprchars = uVar10 - uVar9;
            return 1;
          }
          ensure_range_buf_space(this);
          sVar2 = this->range_buf_cnt_;
          this->range_buf_cnt_ = sVar2 + 1;
          this->range_buf_[sVar2] = L'\0';
          sVar2 = this->range_buf_cnt_;
          this->range_buf_cnt_ = sVar2 + 1;
          this->range_buf_[sVar2] = wVar6;
        }
      }
      if (wVar5 != L'|') {
        build_char_range(this,result_machine,local_50);
        expr->p_ = (char *)p;
        *exprchars = uVar10 - uVar9;
        return 1;
      }
      uVar8 = (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3);
      local_68 = p + uVar8 + 1;
      lVar11 = uVar10 - uVar8;
      uVar10 = ~uVar9 + lVar11;
    } while (lVar11 - 1U != uVar9);
  }
  return 0;
}

Assistant:

int CRegexParser::compile_char_class_expr(utf8_ptr *expr, size_t *exprchars,
                                          re_machine *result_machine)
{
    /* start at the character after the '<' */
    utf8_ptr p = *expr;
    size_t chrem = *exprchars;
    p.inc();
    --chrem;

    /* presume it won't be exclusive */
    int is_exclusive = FALSE;

    /* check for an exclusion flag */
    if (chrem != 0 && p.getch() == '^')
    {
        /* note the exclusion */
        is_exclusive = TRUE;
        
        /* skip the exclusion prefix */
        p.inc();
        --chrem;
    }
    
    /* clear out the range builder buffer */
    range_buf_cnt_ = 0;
    
    /* 
     *   keep going until we find the closing delimiter (or run out of
     *   expression string) 
     */
    for (;;)
    {
        utf8_ptr start;
        wchar_t delim;
        size_t curcharlen;
        size_t curbytelen;
        
        /* remember where the current part starts */
        start = p;
        
        /* scan for the '>' or '|' */
        for (curcharlen = 0 ; chrem != 0 ; p.inc(), --chrem, ++curcharlen)
        {
            /* get the next character */
            delim = p.getch();
            
            /* if it's '>' or '|', we're done */
            if (delim == '>' || delim == '|')
                break;
        }
        
        /* 
         *   If we reached the end of the expression without finding a
         *   closing delimiter, the expression is invalid - treat the whole
         *   thing (starting with the '<') as ordinary characters.  
         */
        if (chrem == 0)
            return FALSE;
        
        /* get the length of this part */
        curbytelen = (size_t)(p.getptr() - start.getptr());
        
        /* 
         *   See what we have.  If we have a single character, it's a
         *   literal.  If we have a character, a hyphen, and another
         *   character, it's a literal range.  Otherwise, it must be one of
         *   our named classes.  
         */
        if (curcharlen == 1)
        {
            /* it's a literal - add the character */
            add_range_char(start.getch());
        }
        else if (curcharlen == 3 && start.getch_at(1) == '-')
        {
            /* it's a literal range - add it */
            add_range_char(start.getch(), start.getch_at(2));
        }
        else
        {
            struct char_class_t
            {
                /* expression name for the class */
                const char *name;
                
                /* length of the class name */
                size_t name_len;
                
                /* 
                 *   literal character, if the name represents a character
                 *   rather than a class - this is used only if code ==
                 *   RE_LITERAL 
                 */
                wchar_t ch;
                
                /* RE_xxx code for the class */
                re_recog_type code;
            };
            static const char_class_t classes[] =
            {
                { "alpha",    5, 0, RE_ALPHA },
                { "digit",    5, 0, RE_DIGIT },
                { "upper",    5, 0, RE_UPPER },
                { "lower",    5, 0, RE_LOWER },
                { "alphanum", 8, 0, RE_ALPHANUM },
                { "space",    5, 0, RE_SPACE },
                { "punct",    5, 0, RE_PUNCT },
                { "newline",  7, 0, RE_NEWLINE },
                { "vspace",   6, 0, RE_VSPACE },
                { "langle",   6, '<', RE_LITERAL },
                { "rangle",   6, '>', RE_LITERAL },
                { "vbar",     4, '|', RE_LITERAL },
                { "caret",    5, '^', RE_LITERAL },
                { "squote",   6, '\'', RE_LITERAL },
                { "dquote",   6, '"', RE_LITERAL },
                { "star",     4, '*', RE_LITERAL },
                { "question", 8, '?', RE_LITERAL },
                { "percent",  7, '%', RE_LITERAL },
                { "dot",      3, '.', RE_LITERAL },
                { "period",   6, '.', RE_LITERAL },
                { "plus",     4, '+', RE_LITERAL },
                { "lsquare",  7, '[', RE_LITERAL },
                { "rsquare",  7, ']', RE_LITERAL },
                { "lparen",   6, '(', RE_LITERAL },
                { "rparen",   6, ')', RE_LITERAL},
                { "lbrace",   6, '{', RE_LITERAL },
                { "rbrace",   6, '}', RE_LITERAL },
                { "dollar",   6, '$', RE_LITERAL },
                { "backslash",9, '\\', RE_LITERAL },
                { "return",   6, 0x000D, RE_LITERAL },
                { "linefeed", 8, 0x000A, RE_LITERAL },
                { "tab",      3, 0x0009, RE_LITERAL },
                { "nul",      3, 0x0000, RE_LITERAL },
                { "null",     4, 0x0000, RE_LITERAL }
            };
            const char_class_t *cp;
            size_t i;
            int found;

            /* scan our name list for a match */
            for (cp = classes, i = 0, found = FALSE ;
                 i < sizeof(classes)/sizeof(classes[0]) ;
                 ++i, ++cp)
            {
                /* 
                 *   if the length matches and the name matches (ignoring
                 *   case), this is the one we want 
                 */
                if (curbytelen == cp->name_len
                    && memicmp(start.getptr(), cp->name, curbytelen) == 0)
                {
                    /* 
                     *   this is it - add either a class range or literal
                     *   range, depending on the meaning of the name 
                     */
                    if (cp->code == RE_LITERAL)
                    {
                        /* it's a name for a literal */
                        add_range_char(cp->ch);
                    }
                    else
                    {
                        /* 
                         *   It's a name for a character class.  As a
                         *   special case for efficiency, if this is the one
                         *   and only thing in this class expression, don't
                         *   create a range expression but instead create a
                         *   special for the class.
                         *   
                         *   Note that we can't do this for an exclusive
                         *   class, since we don't have any special matcher
                         *   for those - implement those with a character
                         *   range as usual.  
                         */
                        if (range_buf_cnt_ == 0
                            && delim == '>'
                            && !is_exclusive)
                        {
                            /*
                             *   This is the only thing, so build a special
                             *   to match this class - this is more
                             *   efficient to store and to match than a
                             *   range expression.  
                             */
                            build_special(result_machine, cp->code, 0);
                            
                            /* skip to the '>' */
                            *expr = p;
                            *exprchars = chrem;
                            
                            /* 
                             *   we're done with the expresion - tell the
                             *   caller we were successful 
                             */
                            return TRUE;
                        }
                        else
                        {
                            /* 
                             *   it's not the only thing, so add the class
                             *   to the range list 
                             */
                            add_range_class(cp->code);
                        }
                    }
                    
                    /* note that we found a match */
                    found = TRUE;
                    
                    /* no need to scan further in our table */
                    break;
                }
            }
            
            /* if we didn't find a match, the whole expression is invalid */
            if (!found)
                return FALSE;
        }
        
        /* 
         *   if we found the '>', we're done; if we found a '|', skip it and
         *   keep going 
         */
        if (delim == '|')
        {
            /* skip the delimiter, and back for another round */
            p.inc(&chrem);
        }
        else
        {
            /* we found the '>', so we're done - add the range recognizer */
            build_char_range(result_machine, is_exclusive);
            
            /* skip up to the '>' */
            *expr = p;
            *exprchars = chrem;
            
            /* tell the caller we were successful */
            return TRUE;
        }
    }
}